

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

void bcf_sr_destroy(bcf_srs_t *files)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < files->nreaders; lVar2 = lVar2 + 1) {
    bcf_sr_destroy1((bcf_sr_t *)((long)&files->readers->file + lVar1));
    lVar1 = lVar1 + 0x60;
  }
  free(files->has_line);
  free(files->readers);
  for (lVar1 = 0; lVar1 < files->n_smpl; lVar1 = lVar1 + 1) {
    free(files->samples[lVar1]);
  }
  free(files->samples);
  if (files->targets != (bcf_sr_regions_t *)0x0) {
    bcf_sr_regions_destroy(files->targets);
  }
  if (files->regions != (bcf_sr_regions_t *)0x0) {
    bcf_sr_regions_destroy(files->regions);
  }
  if ((files->tmps).m != 0) {
    free((files->tmps).s);
  }
  free(files);
  return;
}

Assistant:

void bcf_sr_destroy(bcf_srs_t *files)
{
    int i;
    for (i=0; i<files->nreaders; i++)
        bcf_sr_destroy1(&files->readers[i]);
    free(files->has_line);
    free(files->readers);
    for (i=0; i<files->n_smpl; i++) free(files->samples[i]);
    free(files->samples);
    if (files->targets) bcf_sr_regions_destroy(files->targets);
    if (files->regions) bcf_sr_regions_destroy(files->regions);
    if ( files->tmps.m ) free(files->tmps.s);
    free(files);
}